

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjDumpParser.cpp
# Opt level: O0

bool expectAsmBytes(char **data)

{
  int iVar1;
  int local_1c;
  int i;
  char **data_local;
  
  local_1c = 0;
  do {
    if (6 < local_1c) {
LAB_00144d80:
      while (iVar1 = isspace((int)**data), iVar1 != 0) {
        *data = *data + 1;
      }
      return true;
    }
    iVar1 = isxdigit((int)**data);
    if (((iVar1 == 0) || (iVar1 = isxdigit((int)(*data)[1]), iVar1 == 0)) ||
       (iVar1 = isspace((int)(*data)[2]), iVar1 == 0)) {
      if (local_1c == 0) {
        return false;
      }
      goto LAB_00144d80;
    }
    *data = *data + 3;
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

inline bool expectAsmBytes(char *&data)
{
    for (int i = 0; i < 7; i++) {
        if (!(isxdigit(data[0]) && isxdigit(data[1]) && isspace(data[2]))) {
            if (i == 0) {
                return false;
            }
            break;
        }
        data += 3;
    }

    while (isspace(*data)) {
        ++data;
    }
    return true;
}